

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O3

uint __thiscall
Parse::TPTP::addOverloadedFunction
          (TPTP *this,string *name,int arity,int symbolArity,bool *added,TermList *arg,
          Interpretation integer,Interpretation rational,Interpretation real)

{
  long lVar1;
  Signature *this_00;
  TermList TVar2;
  TermList TVar3;
  OperatorType *type;
  undefined8 *puVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  long *plVar8;
  int i;
  TermList *pTVar9;
  uint uVar10;
  string msg;
  TermList srt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  _Alloc_hider in_stack_fffffffffffffe38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  Interpretation local_188;
  Interpretation local_184;
  string local_180;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  long *local_140 [2];
  long local_130 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  TermList local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  string local_b8;
  string local_98;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  TermList local_38;
  
  if (arity != symbolArity) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe38._M_p,(char *)name);
    Lib::Int::toString_abi_cxx11_(&local_180,(Int *)(ulong)(uint)arity,i);
    std::operator+(name,in_stack_fffffffffffffe28);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      local_1b8._M_allocated_capacity = *psVar7;
      local_1b8._8_8_ = plVar5[3];
    }
    else {
      local_1b8._M_allocated_capacity = *psVar7;
    }
    lVar1 = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Lib::Int::toString_abi_cxx11_(&local_120,(Int *)(ulong)(uint)symbolArity,(int)lVar1);
    std::operator+(name,in_stack_fffffffffffffe28);
    plVar5 = (long *)std::__cxx11::string::append(local_1a8._M_local_buf);
    local_58 = (long *)*plVar5;
    plVar8 = plVar5 + 2;
    if (local_58 == plVar8) {
      local_48 = *plVar8;
      uStack_40 = (undefined4)plVar5[3];
      uStack_3c = *(undefined4 *)((long)plVar5 + 0x1c);
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar8;
    }
    local_50 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    *puVar4 = &PTR_cry_00b3dfc0;
    puVar4[1] = puVar4 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar4 + 1),local_58,local_50 + (long)local_58);
    *puVar4 = &PTR_cry_00b3e0a8;
    *(undefined4 *)(puVar4 + 5) = 0;
    puVar4[6] = puVar4 + 8;
    puVar4[7] = 0;
    *(undefined1 *)(puVar4 + 8) = 0;
    __cxa_throw(puVar4,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  local_188 = real;
  local_184 = rational;
  TVar2 = sortOf(this,arg->_content);
  local_100 = TVar2;
  if (1 < arity) {
    pTVar9 = arg + -1;
    uVar10 = 1;
    do {
      TVar3 = sortOf(this,pTVar9->_content);
      if (TVar3._content != TVar2._content) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffe38,"The interpreted function symbol ",name);
        plVar5 = (long *)std::__cxx11::string::append((char *)&stack0xfffffffffffffe38);
        local_1a8._M_allocated_capacity = *plVar5;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity == paVar6) {
          local_198._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_198._8_8_ = plVar5[3];
          local_1a8._M_allocated_capacity = (size_type)&local_198;
        }
        else {
          local_198._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_1a8._8_8_ = plVar5[1];
        *plVar5 = (long)paVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffe38._M_p != &local_1b8) {
          operator_delete(in_stack_fffffffffffffe38._M_p,local_1b8._M_allocated_capacity + 1);
        }
        Kernel::TermList::toString_abi_cxx11_(&local_78,&local_100,false);
        std::operator+(&local_120,"\nArgument 0 is ",&local_78);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_180._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_180._M_dataplus._M_p == psVar7) {
          local_180.field_2._M_allocated_capacity = *psVar7;
          local_180.field_2._8_8_ = plVar5[3];
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar7;
        }
        local_180._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Lib::Int::toString_abi_cxx11_
                  (&local_98,(Int *)(ulong)uVar10,(int)local_180._M_string_length);
        std::operator+(name,in_stack_fffffffffffffe28);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_140);
        local_160 = (long *)*plVar5;
        plVar8 = plVar5 + 2;
        if (local_160 == plVar8) {
          local_150 = *plVar8;
          lStack_148 = plVar5[3];
          local_160 = &local_150;
        }
        else {
          local_150 = *plVar8;
        }
        local_158 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_38 = sortOf(this,pTVar9->_content);
        Kernel::TermList::toString_abi_cxx11_(&local_b8,&local_38,false);
        std::operator+(name,in_stack_fffffffffffffe28);
        std::__cxx11::string::_M_append
                  (local_1a8._M_local_buf,(ulong)in_stack_fffffffffffffe38._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffe38._M_p != &local_1b8) {
          operator_delete(in_stack_fffffffffffffe38._M_p,local_1b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        if (local_140[0] != local_130) {
          operator_delete(local_140[0],local_130[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_1a8._M_allocated_capacity,
                   local_1a8._8_8_ + local_1a8._M_allocated_capacity);
        *puVar4 = &PTR_cry_00b3dfc0;
        puVar4[1] = puVar4 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar4 + 1),local_d8,local_d8 + local_d0);
        *puVar4 = &PTR_cry_00b3e0a8;
        *(undefined4 *)(puVar4 + 5) = 0;
        puVar4[6] = puVar4 + 8;
        puVar4[7] = 0;
        *(undefined1 *)(puVar4 + 8) = 0;
        __cxa_throw(puVar4,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      uVar10 = uVar10 + 1;
      pTVar9 = pTVar9 + -1;
    } while (arity != uVar10);
  }
  TVar3 = Kernel::AtomicSort::intSort();
  if (TVar2._content != TVar3._content) {
    TVar3 = Kernel::AtomicSort::rationalSort();
    integer = local_184;
    if (TVar2._content != TVar3._content) {
      TVar3 = Kernel::AtomicSort::realSort();
      integer = local_188;
      if (TVar2._content != TVar3._content) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a8,"The symbol ",name);
        plVar5 = (long *)std::__cxx11::string::append(local_1a8._M_local_buf);
        local_f8 = (long *)*plVar5;
        plVar8 = plVar5 + 2;
        if (local_f8 == plVar8) {
          local_e8 = *plVar8;
          uStack_e0 = (undefined4)plVar5[3];
          uStack_dc = *(undefined4 *)((long)plVar5 + 0x1c);
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar8;
        }
        local_f0 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        *puVar4 = &PTR_cry_00b3dfc0;
        puVar4[1] = puVar4 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar4 + 1),local_f8,local_f0 + (long)local_f8);
        *puVar4 = &PTR_cry_00b3e0a8;
        *(undefined4 *)(puVar4 + 5) = 0;
        puVar4[6] = puVar4 + 8;
        puVar4[7] = 0;
        *(undefined1 *)(puVar4 + 8) = 0;
        __cxa_throw(puVar4,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
    }
  }
  this_00 = DAT_00b521b0;
  type = Kernel::Theory::getNonpolymorphicOperatorType(integer);
  uVar10 = Kernel::Signature::addInterpretedFunction(this_00,integer,type,name);
  return uVar10;
}

Assistant:

unsigned TPTP::addOverloadedFunction(std::string name,int arity,int symbolArity,bool& added,TermList& arg,
				     Theory::Interpretation integer,Theory::Interpretation rational,
				     Theory::Interpretation real)
{
  if (arity != symbolArity) {
    USER_ERROR(name + " is used with " + Int::toString(arity) + " argument(s) when there were "+Int::toString(symbolArity)+" expected");
  }
  TermList srt = sortOf(arg);
  TermList* n = arg.next();
  for(int i=1;i<arity;i++){
    if(sortOf(*n)!=srt){
      std::string msg = "The interpreted function symbol " + name + " is not used with a single sort.";
      msg += "\nArgument 0 is "+srt.toString()+" and argument "+Lib::Int::toString(i)+" is "+sortOf(*n).toString();
      USER_ERROR(msg);
    }
    n = n->next();
  }
  if (srt == AtomicSort::intSort()) {
    return env.signature->addInterpretedFunction(integer,name);
  }
  if (srt == AtomicSort::rationalSort()) {
    return env.signature->addInterpretedFunction(rational,name);
  }
  if (srt == AtomicSort::realSort()) {
    return env.signature->addInterpretedFunction(real,name);
  }
  USER_ERROR("The symbol " + name + " is used with a non-numeric type");
}